

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osThread.cpp
# Opt level: O2

void * ThreadEntry(void *param)

{
  long lVar1;
  osThread **ppoVar2;
  long lVar3;
  
  pthread_setspecific(tlsKey,param);
  osEvent::Notify((osEvent *)((long)param + 0x18));
  (**(code **)((long)param + 8))(*(undefined8 *)((long)param + 0x10));
  lVar3 = 0;
  do {
    if (lVar3 == 0x30) {
      return (void *)0x0;
    }
    lVar1 = lVar3 + 1;
    ppoVar2 = Threads + lVar3;
    lVar3 = lVar1;
  } while (*ppoVar2 != (osThread *)param);
  (&tlsKey + lVar1 * 2)[0] = 0;
  (&tlsKey + lVar1 * 2)[1] = 0;
  return (void *)0x0;
}

Assistant:

static void* ThreadEntry(void* param)
{
    osThread* thread = (osThread*)param;
    pthread_setspecific(tlsKey, thread); // Thread Local Storage points to osThread
    thread->ThreadStart.Notify();
    thread->Entry(thread->Param);

    // Now remove self from active thread list
    for (int i = 0; i < MAX_THREADS; i++)
    {
        if (Threads[i] == thread)
        {
            Threads[i] = nullptr;
            break;
        }
    }

    return nullptr;
}